

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

char * BinaryCache::FindBytecode(char *moduleName,bool addExtension)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *bytecode;
  uint e;
  uint i;
  char *pathNoImport;
  char *pathEnd;
  char *modulePath;
  char local_428 [4];
  uint modulePathPos;
  char path [1024];
  uint pathLength;
  uint hash;
  bool addExtension_local;
  char *moduleName_local;
  
  if ((addExtension) || (uVar1 = NULLC::GetStringHash(moduleName), uVar1 != lastHash)) {
    if (addExtension) {
      pcVar3 = strstr(moduleName,".nc");
      if (pcVar3 != (char *)0x0) {
        __assert_fail("strstr(moduleName, \".nc\") == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0xb2,"const char *BinaryCache::FindBytecode(const char *, bool)");
      }
    }
    else {
      pcVar3 = strstr(moduleName,".nc");
      if (pcVar3 == (char *)0x0) {
        __assert_fail("strstr(moduleName, \".nc\") != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0xb4,"const char *BinaryCache::FindBytecode(const char *, bool)");
      }
    }
    path[0x3fc] = '\0';
    path[0x3fd] = '\x04';
    path[0x3fe] = '\0';
    path[0x3ff] = '\0';
    modulePath._4_4_ = 0;
    do {
      pcVar3 = EnumImportPath(modulePath._4_4_);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar2 = NULLC::SafeSprintf(local_428,0x400,"%s%s",pcVar3,moduleName);
      if (addExtension) {
        sVar4 = strlen(pcVar3);
        pcVar3 = local_428 + sVar4;
        bytecode._4_4_ = 0;
        sVar4 = strlen(pcVar3);
        for (; bytecode._4_4_ != (uint)sVar4; bytecode._4_4_ = bytecode._4_4_ + 1) {
          if (pcVar3[bytecode._4_4_] == '.') {
            pcVar3[bytecode._4_4_] = '/';
          }
        }
        NULLC::SafeSprintf(local_428 + iVar2,
                           (ulong)(0x400 - ((int)(local_428 + iVar2) - (int)local_428)),".nc");
      }
      moduleName_local = GetBytecode(local_428);
      modulePath._4_4_ = modulePath._4_4_ + 1;
    } while (moduleName_local == (char *)0x0);
  }
  else {
    moduleName_local = lastBytecode;
  }
  return moduleName_local;
}

Assistant:

const char*	BinaryCache::FindBytecode(const char* moduleName, bool addExtension)
{
	if(!addExtension)
	{
		unsigned int hash = NULLC::GetStringHash(moduleName);

		if(hash == lastHash)
			return lastBytecode;
	}

	if(addExtension)
		assert(strstr(moduleName, ".nc") == 0);
	else
		assert(strstr(moduleName, ".nc") != 0);

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = path + NULLC::SafeSprintf(path, pathLength, "%s%s", modulePath, moduleName);

		if(addExtension)
		{
			char *pathNoImport = path + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, pathLength - int(pathEnd - path), ".nc");
		}

		if(const char *bytecode = BinaryCache::GetBytecode(path))
			return bytecode;
	}

	return NULL;
}